

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkField(google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptorProto_const&)::__2,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  long lVar1;
  Nonnull<char_*> pcVar2;
  size_t in_R9;
  ulong uVar3;
  string_view format;
  ulong local_78;
  long local_70;
  long local_68;
  Nonnull<char_*> local_60;
  long local_58;
  Nonnull<char_*> local_50;
  char local_48 [32];
  
  lVar1 = *(long *)(*(long *)(**(long **)this + 0x20) + 0x10);
  uVar3 = (ulong)*(ushort *)(lVar1 + 2);
  pcVar2 = numbers_internal::FastIntToBuffer(*(int32_t *)(**(long **)this + 4),local_48);
  local_68 = (long)pcVar2 - (long)local_48;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  format._M_str = (char *)&local_78;
  format._M_len = (size_t)"\"$0\" does not declare $1 as an extension number.";
  local_78 = uVar3;
  local_70 = ~uVar3 + lVar1;
  local_60 = local_48;
  local_58 = local_68;
  local_50 = local_48;
  substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)__return_storage_ptr__,(Nonnull<std::string_*>)0x30,format,
             (Nullable<const_absl::string_view_*>)0x2,in_R9);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}